

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O1

FT_Pos af_latin_compute_stem_width
                 (AF_GlyphHints hints,AF_Dimension dim,FT_Pos width,FT_Pos base_delta,
                 FT_UInt base_flags,FT_UInt stem_flags)

{
  ushort uVar1;
  AF_StyleMetrics_conflict pAVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  uVar5 = hints->other_flags;
  if ((uVar5 & 4) == 0) {
    return width;
  }
  pAVar2 = hints->metrics;
  lVar9 = (ulong)dim * 0x47c8;
  if (*(char *)((long)pAVar2 + lVar9 + 0x1f8) != '\0') {
    return width;
  }
  uVar6 = -width;
  if (0 < width) {
    uVar6 = width;
  }
  if (dim == AF_DIMENSION_VERT) {
    uVar3 = uVar5 & 2;
  }
  else {
    uVar3 = uVar5 & 1;
  }
  if (uVar3 == 0) {
    uVar10 = uVar6;
    if (((byte)stem_flags >> 1 & dim == AF_DIMENSION_VERT & uVar6 < 0xc0) == 0) {
      if ((base_flags & 1) == 0) {
        uVar10 = 0x38;
        if (0x38 < (long)uVar6) {
          uVar10 = uVar6;
        }
      }
      else {
        uVar10 = 0x40;
        if (0x4f < uVar6) {
          uVar10 = uVar6;
        }
      }
      if (*(int *)((long)pAVar2 + lVar9 + 0x60) != 0) {
        uVar6 = *(ulong *)((long)pAVar2 + lVar9 + 0x70);
        uVar8 = uVar10 - uVar6;
        uVar7 = -uVar8;
        if (0 < (long)uVar8) {
          uVar7 = uVar8;
        }
        if (uVar7 < 0x28) {
          uVar10 = 0x30;
          if (0x30 < (long)uVar6) {
            uVar10 = uVar6;
          }
        }
        else if ((long)uVar10 < 0xc0) {
          uVar5 = (uint)uVar10 & 0x3f;
          if (9 < uVar5) {
            if (uVar5 < 0x20) {
              uVar10 = uVar10 & 0xffffffffffffffc0 | 10;
            }
            else if (uVar5 < 0x36) {
              uVar10 = uVar10 & 0xffffffffffffffc0 | 0x36;
            }
          }
        }
        else {
          if ((base_delta < 1 || width < 1) && -1 < (base_delta & width)) {
            lVar9 = 0;
          }
          else {
            uVar1 = (((pAVar2->scaler).face)->size->metrics).x_ppem;
            if (9 < uVar1) {
              if (uVar1 < 0x1e) {
                base_delta = (long)((ulong)(0x1e - uVar1) * base_delta) / 0x14;
              }
              else {
                base_delta = 0;
              }
            }
            lVar9 = -base_delta;
            if (0 < base_delta) {
              lVar9 = base_delta;
            }
          }
          uVar10 = (uVar10 - lVar9) + 0x20 & 0xffffffffffffffc0;
        }
      }
    }
    goto LAB_001853cc;
  }
  uVar10 = (ulong)*(uint *)((long)pAVar2 + lVar9 + 0x60);
  uVar7 = uVar6;
  if (uVar10 != 0) {
    lVar11 = 0x62;
    lVar12 = 0;
    do {
      uVar8 = *(ulong *)((long)pAVar2 + lVar12 + lVar9 + 0x70);
      lVar13 = uVar6 - uVar8;
      lVar14 = -lVar13;
      if (0 < lVar13) {
        lVar14 = lVar13;
      }
      if (lVar14 < lVar11) {
        uVar7 = uVar8;
        lVar11 = lVar14;
      }
      lVar12 = lVar12 + 0x18;
    } while (uVar10 * 0x18 != lVar12);
  }
  uVar10 = uVar7 + 0x20 & 0xffffffffffffffc0;
  bVar4 = (long)uVar6 < (long)(uVar10 + 0x30);
  if ((long)uVar6 < (long)uVar7) {
    bVar4 = (long)(uVar10 - 0x30) < (long)uVar6;
  }
  if (!bVar4) {
    uVar7 = uVar6;
  }
  if (dim == AF_DIMENSION_VERT) {
    uVar10 = 0x40;
    if ((long)uVar7 < 0x40) goto LAB_001853cc;
    uVar7 = uVar7 + 0x10;
  }
  else {
    if ((uVar5 & 8) == 0) {
      if ((long)uVar7 < 0x30) {
        uVar10 = (long)(uVar7 + 0x40) >> 1;
      }
      else if ((long)uVar7 < 0x80) {
        uVar10 = uVar7 + 0x16 & 0x7fffffffffffffc0;
        uVar8 = uVar10 - uVar6;
        uVar7 = -uVar8;
        if (0 < (long)uVar8) {
          uVar7 = uVar8;
        }
        if ((0xf < uVar7) && (uVar10 = uVar6, uVar6 < 0x30)) {
          uVar10 = uVar6 >> 1 | 0x20;
        }
      }
      else {
        uVar10 = uVar7 + 0x20 & 0x7fffffffffffffc0;
      }
      goto LAB_001853cc;
    }
    uVar10 = 0x40;
    if ((long)uVar7 < 0x40) goto LAB_001853cc;
    uVar7 = uVar7 + 0x20;
  }
  uVar10 = uVar7 & 0x7fffffffffffffc0;
LAB_001853cc:
  uVar6 = -uVar10;
  if (-1 < width) {
    uVar6 = uVar10;
  }
  return uVar6;
}

Assistant:

static FT_Pos
  af_latin_compute_stem_width( AF_GlyphHints  hints,
                               AF_Dimension   dim,
                               FT_Pos         width,
                               FT_Pos         base_delta,
                               FT_UInt        base_flags,
                               FT_UInt        stem_flags )
  {
    AF_LatinMetrics  metrics  = (AF_LatinMetrics)hints->metrics;
    AF_LatinAxis     axis     = &metrics->axis[dim];
    FT_Pos           dist     = width;
    FT_Int           sign     = 0;
    FT_Int           vertical = ( dim == AF_DIMENSION_VERT );


    if ( !AF_LATIN_HINTS_DO_STEM_ADJUST( hints ) ||
         axis->extra_light                       )
      return width;

    if ( dist < 0 )
    {
      dist = -width;
      sign = 1;
    }

    if ( (  vertical && !AF_LATIN_HINTS_DO_VERT_SNAP( hints ) ) ||
         ( !vertical && !AF_LATIN_HINTS_DO_HORZ_SNAP( hints ) ) )
    {
      /* smooth hinting process: very lightly quantize the stem width */

      /* leave the widths of serifs alone */
      if ( ( stem_flags & AF_EDGE_SERIF ) &&
           vertical                       &&
           ( dist < 3 * 64 )              )
        goto Done_Width;

      else if ( base_flags & AF_EDGE_ROUND )
      {
        if ( dist < 80 )
          dist = 64;
      }
      else if ( dist < 56 )
        dist = 56;

      if ( axis->width_count > 0 )
      {
        FT_Pos  delta;


        /* compare to standard width */
        delta = dist - axis->widths[0].cur;

        if ( delta < 0 )
          delta = -delta;

        if ( delta < 40 )
        {
          dist = axis->widths[0].cur;
          if ( dist < 48 )
            dist = 48;

          goto Done_Width;
        }

        if ( dist < 3 * 64 )
        {
          delta  = dist & 63;
          dist  &= -64;

          if ( delta < 10 )
            dist += delta;

          else if ( delta < 32 )
            dist += 10;

          else if ( delta < 54 )
            dist += 54;

          else
            dist += delta;
        }
        else
        {
          /* A stem's end position depends on two values: the start        */
          /* position and the stem length.  The former gets usually        */
          /* rounded to the grid, while the latter gets rounded also if it */
          /* exceeds a certain length (see below in this function).  This  */
          /* `double rounding' can lead to a great difference to the       */
          /* original, unhinted position; this normally doesn't matter for */
          /* large PPEM values, but for small sizes it can easily make     */
          /* outlines collide.  For this reason, we adjust the stem length */
          /* by a small amount depending on the PPEM value in case the     */
          /* former and latter rounding both point into the same           */
          /* direction.                                                    */

          FT_Pos  bdelta = 0;


          if ( ( ( width > 0 ) && ( base_delta > 0 ) ) ||
               ( ( width < 0 ) && ( base_delta < 0 ) ) )
          {
            FT_UInt  ppem = metrics->root.scaler.face->size->metrics.x_ppem;


            if ( ppem < 10 )
              bdelta = base_delta;
            else if ( ppem < 30 )
              bdelta = ( base_delta * (FT_Pos)( 30 - ppem ) ) / 20;

            if ( bdelta < 0 )
              bdelta = -bdelta;
          }

          dist = ( dist - bdelta + 32 ) & ~63;
        }
      }
    }
    else
    {
      /* strong hinting process: snap the stem width to integer pixels */

      FT_Pos  org_dist = dist;


      dist = af_latin_snap_width( axis->widths, axis->width_count, dist );

      if ( vertical )
      {
        /* in the case of vertical hinting, always round */
        /* the stem heights to integer pixels            */

        if ( dist >= 64 )
          dist = ( dist + 16 ) & ~63;
        else
          dist = 64;
      }
      else
      {
        if ( AF_LATIN_HINTS_DO_MONO( hints ) )
        {
          /* monochrome horizontal hinting: snap widths to integer pixels */
          /* with a different threshold                                   */

          if ( dist < 64 )
            dist = 64;
          else
            dist = ( dist + 32 ) & ~63;
        }
        else
        {
          /* for horizontal anti-aliased hinting, we adopt a more subtle */
          /* approach: we strengthen small stems, round stems whose size */
          /* is between 1 and 2 pixels to an integer, otherwise nothing  */

          if ( dist < 48 )
            dist = ( dist + 64 ) >> 1;

          else if ( dist < 128 )
          {
            /* We only round to an integer width if the corresponding */
            /* distortion is less than 1/4 pixel.  Otherwise this     */
            /* makes everything worse since the diagonals, which are  */
            /* not hinted, appear a lot bolder or thinner than the    */
            /* vertical stems.                                        */

            FT_Pos  delta;


            dist = ( dist + 22 ) & ~63;
            delta = dist - org_dist;
            if ( delta < 0 )
              delta = -delta;

            if ( delta >= 16 )
            {
              dist = org_dist;
              if ( dist < 48 )
                dist = ( dist + 64 ) >> 1;
            }
          }
          else
            /* round otherwise to prevent color fringes in LCD mode */
            dist = ( dist + 32 ) & ~63;
        }
      }
    }

  Done_Width:
    if ( sign )
      dist = -dist;

    return dist;
  }